

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

optional<n_e_s::core::Pixel> __thiscall n_e_s::core::Ppu::pixel(Ppu *this)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  PpuRegisters *pPVar7;
  uint uVar8;
  
  pPVar7 = this->registers_;
  uVar1 = pPVar7->cycle;
  uVar8 = (uint)uVar1;
  uVar3 = uVar1 - 1 & 0xffff;
  uVar5 = (ulong)uVar3;
  if (uVar3 < 0x100) {
    bVar2 = (pPVar7->mask).super_Register<unsigned_char>.value_;
    iVar4 = 0x3f00;
    if (((bVar2 & 8) == 0) || (uVar1 < 9 && (bVar2 & 2) == 0)) {
      bVar2 = 0;
    }
    else {
      uVar8 = 0x8000 >> (pPVar7->fine_x_scroll & 0x1f);
      bVar2 = ((uVar8 & pPVar7->pattern_table_shifter_hi) != 0) * '\x02' |
              (uVar8 & pPVar7->pattern_table_shifter_low) != 0;
      iVar4 = (uint)((uVar8 & pPVar7->attribute_table_shifter_low) != 0) * 4 +
              (uint)((uVar8 & pPVar7->attribute_table_shifter_hi) != 0) * 8 + 0x3f00;
    }
    iVar6 = 0x3f00;
    if (bVar2 != 0) {
      iVar6 = iVar4;
    }
    iVar4 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)((uint)bVar2 + iVar6));
    uVar8 = (uint)*(uint3 *)(::(anonymous_namespace)::kPalette + (ulong)((byte)iVar4 & 0x3f) * 3);
    pPVar7 = (PpuRegisters *)(ulong)(byte)this->registers_->scanline;
    uVar5 = (ulong)(byte)((char)this->registers_->cycle - 1);
    bVar2 = 1;
  }
  else {
    bVar2 = 0;
  }
  return (_Optional_base<n_e_s::core::Pixel,_true,_true>)
         ((uint6)uVar5 & 0xff |
         (uint6)(((uint)pPVar7 & 0xff) << 8) | (uint6)uVar8 << 0x10 | (uint6)bVar2 << 0x28);
}

Assistant:

uint16_t &Ppu::cycle() {
    return registers_->cycle;
}